

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O1

grid_split * idx2::SplitAlternate(grid_split *__return_storage_ptr__,grid *Grid,dimension D)

{
  int *piVar1;
  int iVar2;
  u64 uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  v3i Mask3;
  v3i NewStrd3;
  ulong local_50;
  uint local_48;
  ulong local_40;
  uint local_38;
  ulong local_30;
  uint local_28;
  ulong local_20;
  uint local_18;
  ulong local_10;
  uint local_8;
  
  uVar3 = (Grid->super_extent).Dims;
  local_10 = (long)(uVar3 << 0x16) >> 0xb & 0xffffffff00000000U |
             (ulong)(uint)((long)(uVar3 << 0x2b) >> 0x2b);
  local_8 = (uint)((long)(uVar3 * 2) >> 0x2b);
  uVar3 = Grid->Strd;
  local_20 = (long)(uVar3 << 0x16) >> 0xb & 0xffffffff00000000U |
             (ulong)(uint)((long)(uVar3 << 0x2b) >> 0x2b);
  local_18 = (uint)((long)(uVar3 * 2) >> 0x2b);
  uVar3 = (Grid->super_extent).From;
  local_30 = (long)(uVar3 << 0x16) >> 0xb & 0xffffffff00000000U |
             (ulong)(uint)((long)(uVar3 << 0x2b) >> 0x2b);
  local_28 = (uint)((long)(uVar3 * 2) >> 0x2b);
  if ((int)D < 3) {
    lVar4 = (long)(int)D;
    piVar1 = (int *)((long)&local_30 + lVar4 * 4);
    *piVar1 = *piVar1 + *(int *)((long)&local_20 + lVar4 * 4);
    (__return_storage_ptr__->First).Strd = Grid->Strd;
    uVar3 = (Grid->super_extent).Dims;
    (__return_storage_ptr__->First).super_extent.From = (Grid->super_extent).From;
    (__return_storage_ptr__->First).super_extent.Dims = uVar3;
    (__return_storage_ptr__->Second).Strd = Grid->Strd;
    uVar3 = (Grid->super_extent).Dims;
    (__return_storage_ptr__->Second).super_extent.From = (Grid->super_extent).From;
    (__return_storage_ptr__->Second).super_extent.Dims = uVar3;
    local_48 = local_8;
    local_50 = local_10;
    iVar2 = *(int *)((long)&local_10 + lVar4 * 4);
    iVar5 = iVar2 + 1 >> 1;
    *(int *)((long)&local_50 + lVar4 * 4) = iVar5;
    local_38 = local_18;
    local_40 = local_20;
    piVar1 = (int *)((long)&local_40 + lVar4 * 4);
    *piVar1 = *piVar1 << 1;
    (__return_storage_ptr__->First).super_extent.Dims =
         (ulong)(local_48 & 0x1fffff) << 0x2a |
         (local_50 >> 0x20 & 0x1fffff) << 0x15 | local_50 & 0x1fffff;
    uVar6 = (ulong)(local_38 & 0x1fffff) << 0x2a |
            (local_40 >> 0x20 & 0x1fffff) << 0x15 | local_40 & 0x1fffff;
    (__return_storage_ptr__->First).Strd = uVar6;
    *(int *)((long)&local_50 + lVar4 * 4) = iVar2 - iVar5;
    (__return_storage_ptr__->Second).super_extent.Dims =
         (ulong)(local_48 & 0x1fffff) << 0x2a |
         (local_50 >> 0x20 & 0x1fffff) << 0x15 | local_50 & 0x1fffff;
    (__return_storage_ptr__->Second).Strd = uVar6;
    (__return_storage_ptr__->Second).super_extent.From =
         (ulong)(local_28 & 0x1fffff) << 0x2a |
         (local_30 >> 0x20 & 0x1fffff) << 0x15 | local_30 & 0x1fffff;
    return __return_storage_ptr__;
  }
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

grid_split
SplitAlternate(const grid& Grid, dimension D)
{
  v3i Dims3 = Dims(Grid);
  v3i Strd3 = Strd(Grid);
  v3i From3 = From(Grid);
  From3[D] += Strd3[D];
  grid_split GridSplit{ Grid, Grid };
  v3i Mask3 = Dims3;
  Mask3[D] = (Dims3[D] + 1) >> 1;
  SetDims(&GridSplit.First, Mask3);
  v3i NewStrd3 = Strd3;
  NewStrd3[D] <<= 1;
  SetStrd(&GridSplit.First, NewStrd3);
  Mask3[D] = Dims3[D] - Mask3[D];
  SetDims(&GridSplit.Second, Mask3);
  SetStrd(&GridSplit.Second, NewStrd3);
  SetFrom(&GridSplit.Second, From3);
  return GridSplit;
}